

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O3

int __thiscall KParser::_statement(KParser *this,int begin,BlockInfo *bi)

{
  pointer pcVar1;
  int iVar2;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  char local_240 [16];
  undefined1 local_230 [32];
  _Alloc_hider local_210;
  char local_200 [16];
  undefined1 local_1f0 [32];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  char local_180 [16];
  BlockInfo local_170;
  BlockInfo local_130;
  BlockInfo local_f0;
  BlockInfo local_b0;
  BlockInfo local_70;
  
  pcVar1 = (bi->sLabel)._M_dataplus._M_p;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,pcVar1,pcVar1 + (bi->sLabel)._M_string_length);
  pcVar1 = (bi->eLabel)._M_dataplus._M_p;
  local_190._M_p = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (bi->eLabel)._M_string_length);
  iVar2 = _if(this,begin,(BlockInfo *)local_1b0);
  if (local_190._M_p != local_180) {
    operator_delete(local_190._M_p);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if (iVar2 < 0) {
    pcVar1 = (bi->sLabel)._M_dataplus._M_p;
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,pcVar1,pcVar1 + (bi->sLabel)._M_string_length);
    pcVar1 = (bi->eLabel)._M_dataplus._M_p;
    local_1d0._M_p = local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar1,pcVar1 + (bi->eLabel)._M_string_length);
    iVar2 = _while(this,begin,(BlockInfo *)local_1f0);
    if (local_1d0._M_p != local_1c0) {
      operator_delete(local_1d0._M_p);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_);
    }
    if (iVar2 < 0) {
      pcVar1 = (bi->sLabel)._M_dataplus._M_p;
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,pcVar1,pcVar1 + (bi->sLabel)._M_string_length);
      pcVar1 = (bi->eLabel)._M_dataplus._M_p;
      local_210._M_p = local_200;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar1,pcVar1 + (bi->eLabel)._M_string_length);
      iVar2 = _assign(this,begin,(BlockInfo *)local_230);
      if (local_210._M_p != local_200) {
        operator_delete(local_210._M_p);
      }
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_);
      }
      if (iVar2 < 0) {
        pcVar1 = (bi->sLabel)._M_dataplus._M_p;
        local_270._0_8_ = local_270 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_270,pcVar1,pcVar1 + (bi->sLabel)._M_string_length);
        pcVar1 = (bi->eLabel)._M_dataplus._M_p;
        local_250._M_p = local_240;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,pcVar1,pcVar1 + (bi->eLabel)._M_string_length);
        iVar2 = _decassign(this,begin,(BlockInfo *)local_270);
        if (local_250._M_p != local_240) {
          operator_delete(local_250._M_p);
        }
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_);
        }
        if (iVar2 < 0) {
          BlockInfo::BlockInfo(&local_70,bi);
          iVar2 = _block(this,begin,&local_70);
          BlockInfo::~BlockInfo(&local_70);
          if (iVar2 < 0) {
            BlockInfo::BlockInfo(&local_b0,bi);
            iVar2 = _break(this,begin,&local_b0);
            BlockInfo::~BlockInfo(&local_b0);
            if (iVar2 < 0) {
              BlockInfo::BlockInfo(&local_f0,bi);
              iVar2 = _continue(this,begin,&local_f0);
              BlockInfo::~BlockInfo(&local_f0);
              if (iVar2 < 0) {
                BlockInfo::BlockInfo(&local_130,bi);
                iVar2 = _simple_expr(this,begin,&local_130);
                BlockInfo::~BlockInfo(&local_130);
                if (iVar2 < 0) {
                  BlockInfo::BlockInfo(&local_170,bi);
                  iVar2 = _return(this,begin,&local_170);
                  BlockInfo::~BlockInfo(&local_170);
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int KParser::_statement(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if((t = _if(i, bi)) >= 0) {
        i = t;
    } else if((t = _while(i, bi)) >= 0) {
        i = t;
    }else if((t = _assign(i, bi)) >= 0) {
        i = t;
    } else if((t = _decassign(i, bi)) >= 0) {
        i = t;
    } else if((t = _block(i, bi)) >= 0) {
        i = t;
    } else if((t = _break(i, bi)) >= 0) {
        i = t;
    } else if((t = _continue(i, bi)) >= 0) {
        i = t;
    }else if((t = _simple_expr(i, bi)) >= 0) {
        i = t;
    } else if((t = _return(i, bi)) >= 0) {
        i = t;
    } else {
        return -1;
    }
    return i;
}